

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# training.cc
# Opt level: O2

void __thiscall dynet::AdadeltaTrainer::update_params(AdadeltaTrainer *this,real gscale,size_t idx)

{
  ParameterStorage *pPVar1;
  ParameterCollectionStorage *pPVar2;
  initializer_list<dynet::Tensor_*> __l;
  allocator_type local_4d;
  real local_4c;
  _Vector_base<dynet::Tensor_*,_std::allocator<dynet::Tensor_*>_> local_48;
  Tensor *local_30;
  Tensor *local_28;
  pointer local_20;
  pointer local_18;
  
  local_4c = gscale;
  pPVar2 = ParameterCollection::get_storage((this->super_Trainer).model);
  pPVar1 = (pPVar2->params).
           super__Vector_base<dynet::ParameterStorage_*,_std::allocator<dynet::ParameterStorage_*>_>
           ._M_impl.super__Vector_impl_data._M_start[idx];
  local_30 = &pPVar1->values;
  local_28 = &pPVar1->g;
  local_20 = (this->hg).
             super__Vector_base<dynet::ShadowParameters,_std::allocator<dynet::ShadowParameters>_>.
             _M_impl.super__Vector_impl_data._M_start + idx;
  local_18 = (this->hd).
             super__Vector_base<dynet::ShadowParameters,_std::allocator<dynet::ShadowParameters>_>.
             _M_impl.super__Vector_impl_data._M_start + idx;
  __l._M_len = 4;
  __l._M_array = &local_30;
  std::vector<dynet::Tensor_*,_std::allocator<dynet::Tensor_*>_>::vector
            ((vector<dynet::Tensor_*,_std::allocator<dynet::Tensor_*>_> *)&local_48,__l,&local_4d);
  (*(this->super_Trainer)._vptr_Trainer[5])(local_4c,this,&local_48);
  std::_Vector_base<dynet::Tensor_*,_std::allocator<dynet::Tensor_*>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

void AdadeltaTrainer::update_params(real gscale, size_t idx) {
  auto & p = model->parameters_list()[idx];
  update_rule(gscale, {&p->values, &p->g, &hg[idx].h, &hd[idx].h});
}